

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall
coins_tests::FlushTest::TestFlushBehavior
          (FlushTest *this,CCoinsViewCacheTest *view,CCoinsViewDB *base,
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          *all_caches,bool do_erasing_flush)

{
  FastRandomContext *this_00;
  CCoinsMap *map;
  CCoinsViewCache *pCVar1;
  __uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  _Var2;
  bool bVar3;
  readonly_property<bool> rVar4;
  readonly_property65 rVar5;
  byte bVar6;
  undefined1 uVar7;
  int iVar8;
  pointer puVar9;
  undefined7 in_register_00000081;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long in_FS_OFFSET;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<std::byte> output_00;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  Span<std::byte> output_01;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  Span<std::byte> output_02;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  Span<std::byte> output_03;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  Span<std::byte> output_04;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  Span<std::byte> output_05;
  Span<std::byte> output_06;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  check_type cVar12;
  char *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 local_8dc [4];
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  CAmount coin_val;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  size_t cache_size;
  size_t cache_usage;
  char flags;
  CAmount value;
  uint256 *local_140;
  assertion_result local_138;
  uint256 **local_120;
  size_t *local_118;
  char *local_110;
  char *local_108;
  assertion_result local_100;
  uint256 ret_1;
  uint local_c4;
  uint256 ret;
  uint local_94;
  COutPoint local_88;
  uchar local_58 [8];
  uchar auStack_50 [8];
  uchar local_48 [8];
  uchar auStack_40 [8];
  long local_38;
  
  pvVar10 = (iterator)CONCAT71(in_register_00000081,do_erasing_flush);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&ret;
  FastRandomContext::fillrand(this_00,output);
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       ret.super_base_blob<256U>.m_data._M_elems[0x14];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       ret.super_base_blob<256U>.m_data._M_elems[0x15];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       ret.super_base_blob<256U>.m_data._M_elems[0x16];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       ret.super_base_blob<256U>.m_data._M_elems[0x17];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       ret.super_base_blob<256U>.m_data._M_elems[0x10];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       ret.super_base_blob<256U>.m_data._M_elems[0x11];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       ret.super_base_blob<256U>.m_data._M_elems[0x12];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       ret.super_base_blob<256U>.m_data._M_elems[0x13];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       ret.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       ret.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       ret.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       ret.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       ret.super_base_blob<256U>.m_data._M_elems[0x18];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       ret.super_base_blob<256U>.m_data._M_elems[0x19];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       ret.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       ret.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_58[0] = ret.super_base_blob<256U>.m_data._M_elems[0];
  local_58[1] = ret.super_base_blob<256U>.m_data._M_elems[1];
  local_58[2] = ret.super_base_blob<256U>.m_data._M_elems[2];
  local_58[3] = ret.super_base_blob<256U>.m_data._M_elems[3];
  local_58[4] = ret.super_base_blob<256U>.m_data._M_elems[4];
  local_58[5] = ret.super_base_blob<256U>.m_data._M_elems[5];
  local_58[6] = ret.super_base_blob<256U>.m_data._M_elems[6];
  local_58[7] = ret.super_base_blob<256U>.m_data._M_elems[7];
  auStack_50[0] = ret.super_base_blob<256U>.m_data._M_elems[8];
  auStack_50[1] = ret.super_base_blob<256U>.m_data._M_elems[9];
  auStack_50[2] = ret.super_base_blob<256U>.m_data._M_elems[10];
  auStack_50[3] = ret.super_base_blob<256U>.m_data._M_elems[0xb];
  auStack_50[4] = ret.super_base_blob<256U>.m_data._M_elems[0xc];
  auStack_50[5] = ret.super_base_blob<256U>.m_data._M_elems[0xd];
  auStack_50[6] = ret.super_base_blob<256U>.m_data._M_elems[0xe];
  auStack_50[7] = ret.super_base_blob<256U>.m_data._M_elems[0xf];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       ret.super_base_blob<256U>.m_data._M_elems[0];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       ret.super_base_blob<256U>.m_data._M_elems[1];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       ret.super_base_blob<256U>.m_data._M_elems[2];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       ret.super_base_blob<256U>.m_data._M_elems[3];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       ret.super_base_blob<256U>.m_data._M_elems[4];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       ret.super_base_blob<256U>.m_data._M_elems[5];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       ret.super_base_blob<256U>.m_data._M_elems[6];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       ret.super_base_blob<256U>.m_data._M_elems[7];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       ret.super_base_blob<256U>.m_data._M_elems[8];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       ret.super_base_blob<256U>.m_data._M_elems[9];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       ret.super_base_blob<256U>.m_data._M_elems[10];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       ret.super_base_blob<256U>.m_data._M_elems[0xb];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       ret.super_base_blob<256U>.m_data._M_elems[0xc];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       ret.super_base_blob<256U>.m_data._M_elems[0xd];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       ret.super_base_blob<256U>.m_data._M_elems[0xe];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       ret.super_base_blob<256U>.m_data._M_elems[0xf];
  local_88.n = 0;
  local_48 = (uchar  [8])local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  auStack_40 = (uchar  [8])local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  MakeCoin((Coin *)&ret,this);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3b4;
  file.m_begin = (iterator)&local_170;
  msg.m_end = in_R9;
  msg.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_180,msg);
  _cVar12 = 0x32cb18;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_188 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_190,0x3b4);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3b5;
  file_00.m_begin = (iterator)&local_1a0;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  _cVar12 = 0x32cbf7;
  iVar8 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,&local_88);
  local_138._0_8_ = CONCAT71(local_138._1_7_,(char)iVar8) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!view->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1b8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_1c0,0x3b5);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = ret.super_base_blob<256U>.m_data._M_elems[0];
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = ret.super_base_blob<256U>.m_data._M_elems[1];
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ret.super_base_blob<256U>.m_data._M_elems[2];
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = ret.super_base_blob<256U>.m_data._M_elems[3];
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = ret.super_base_blob<256U>.m_data._M_elems[4];
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = ret.super_base_blob<256U>.m_data._M_elems[5];
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = ret.super_base_blob<256U>.m_data._M_elems[6];
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = ret.super_base_blob<256U>.m_data._M_elems[7];
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (ret_1.super_base_blob<256U>.m_data._M_elems + 8),
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (ret.super_base_blob<256U>.m_data._M_elems + 8));
  CCoinsViewCache::AddCoin(&view->super_CCoinsViewCache,&local_88,(Coin *)&ret_1,false);
  if (0x1c < local_c4) {
    free((void *)ret_1.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  cache_usage = CCoinsViewCache::DynamicMemoryUsage(&view->super_CCoinsViewCache);
  cache_size = (view->super_CCoinsViewCache).cacheCoins._M_h._M_element_count;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x3bf;
  file_01.m_begin = (iterator)&local_1d0;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  _cVar12 = 0x32cd5b;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1e8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_1f0,0x3bf);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3c0;
  file_02.m_begin = (iterator)&local_200;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_210,
             msg_02);
  _cVar12 = 0x32ce3b;
  iVar8 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)SUB41(iVar8,0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!view->HaveCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_218 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_220,0x3c0);
  map = &(view->super_CCoinsViewCache).cacheCoins;
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  GetCoinsMapEntry(map,&value,&flags,&local_88);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x3c3;
  file_03.m_begin = (iterator)&local_230;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_120 = &local_140;
  local_140 = &ret;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013892a8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&value;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(value == ret.super_base_blob<256U>.m_data._M_elems._0_8_);
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x3c3,
             &ret_1,"coin.out.nValue",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3c4;
  file_04.m_begin = (iterator)&local_270;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_280,
             msg_04);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_140 = (uint256 *)&coin_val;
  coin_val = CONCAT44(coin_val._4_4_,3);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(flags == '\x03');
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013890c8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&flags;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x3c4,
             &ret_1,"DIRTY|FRESH",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  puVar9 = (all_caches->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != (all_caches->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    do {
      CCoinsViewCache::SanityCheck
                (&(puVar9[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
      puVar9 = puVar9 + -1;
      pCVar1 = &((puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl)->super_CCoinsViewCache;
      ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      output_00.m_size = 0x20;
      output_00.m_data = (byte *)&ret_1;
      FastRandomContext::fillrand(this_00,output_00);
      CCoinsViewCache::SetBestBlock(pCVar1,&ret_1);
      CCoinsViewCache::Sync
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
    } while (puVar9 != (all_caches->
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x3cb;
  file_05.m_begin = (iterator)&local_290;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2a0,
             msg_05);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  coin_val = CCoinsViewCache::DynamicMemoryUsage(&view->super_CCoinsViewCache);
  local_118 = &cache_usage;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f48;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&coin_val;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_01388f48;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cache_usage == coin_val);
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe4b20f,(size_t)&local_110,0x3cb,
             &ret_1,"view->DynamicMemoryUsage()",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3cc;
  file_06.m_begin = (iterator)&local_2b8;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c8,
             msg_06);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  coin_val = (view->super_CCoinsViewCache).cacheCoins._M_h._M_element_count;
  local_118 = &cache_size;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cache_size == coin_val);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f48;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&coin_val;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_01388f48;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe4b230,(size_t)&local_110,0x3cc,
             &ret_1,"view->map().size()",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  GetCoinsMapEntry(map,&value,&flags,&local_88);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3d1;
  file_07.m_begin = (iterator)&local_2d8;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e8,
             msg_07);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(value == ret.super_base_blob<256U>.m_data._M_elems._0_8_);
  local_248 = "";
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = &ret;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013892a8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&value;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x3d1,
             &ret_1,"coin.out.nValue",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x3d2;
  file_08.m_begin = (iterator)&local_2f8;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_308,
             msg_08);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(flags == '\0');
  coin_val = coin_val & 0xffffffff00000000;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&coin_val;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013890c8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&flags;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x3d2,
             &ret_1,"0",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x3d5;
  file_09.m_begin = (iterator)&local_318;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328,
             msg_09);
  _cVar12 = 0x32d84b;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!base.HaveCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_330 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_338,0x3d5);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x3d6;
  file_10.m_begin = (iterator)&local_348;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_358,
             msg_10);
  _cVar12 = 0x32d929;
  iVar8 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(char)iVar8;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!view->HaveCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_360 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_368,0x3d6);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  if (do_erasing_flush) {
    puVar9 = (all_caches->
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != (all_caches->
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) {
      do {
        CCoinsViewCache::SanityCheck
                  (&(puVar9[-1]._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl)->super_CCoinsViewCache);
        puVar9 = puVar9 + -1;
        pCVar1 = &((puVar9->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache;
        ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        output_01.m_size = 0x20;
        output_01.m_data = (byte *)&ret_1;
        FastRandomContext::fillrand(this_00,output_01);
        CCoinsViewCache::SetBestBlock(pCVar1,&ret_1);
        CCoinsViewCache::Flush
                  (&((puVar9->_M_t).
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl)->super_CCoinsViewCache);
      } while (puVar9 != (all_caches->
                         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    }
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_370 = "";
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x3de;
    file_11.m_begin = (iterator)&local_378;
    msg_11.m_end = pvVar11;
    msg_11.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_388,
               msg_11);
    local_260._0_8_ = CCoinsViewCache::DynamicMemoryUsage(&view->super_CCoinsViewCache);
    local_260._8_8_ = &cache_usage;
    _cVar12 = 0x32da94;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_138,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)local_260,false);
    local_100._0_8_ = "view->DynamicMemoryUsage() <= cache_usage";
    local_100.m_message.px = (element_type *)0xe4b21a;
    ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_100;
    local_398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_390 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_138,(lazy_ostream *)&ret_1,1,0xe,WARN,_cVar12,(size_t)&local_398,0x3de);
    boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
    local_3a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3a0 = "";
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x3e0;
    file_12.m_begin = (iterator)&local_3a8;
    msg_12.m_end = pvVar11;
    msg_12.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b8,
               msg_12);
    local_260._0_8_ = (view->super_CCoinsViewCache).cacheCoins._M_h._M_element_count;
    local_260._8_8_ = &cache_size;
    _cVar12 = 0x32db93;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LT<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_138,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LT<unsigned_long,_unsigned_long,_void>_>
                *)local_260,false);
    local_100._0_8_ = "view->map().size() < cache_size";
    local_100.m_message.px = (element_type *)0xe4b23a;
    ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_100;
    local_3c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3c0 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_138,(lazy_ostream *)&ret_1,1,0xe,WARN,_cVar12,(size_t)&local_3c8,0x3e0);
    boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
    GetCoinsMapEntry(map,&value,&flags,&local_88);
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3d0 = "";
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x3e5;
    file_13.m_begin = (iterator)&local_3d8;
    msg_13.m_end = pvVar11;
    msg_13.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3e8,
               msg_13);
    local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
    local_260._0_8_ = &PTR__lazy_ostream_01388f08;
    local_250 = boost::unit_test::lazy_ostream::inst;
    local_248 = "";
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_108 = "";
    ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
    local_140 = (uint256 *)&ABSENT;
    local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
    local_138._0_8_ = &PTR__lazy_ostream_013892a8;
    local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_120 = &local_140;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_118 = (size_t *)&value;
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(value == -2);
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x3e5,
               (lazy_ostream *)&ret_1,"ABSENT",&local_138);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    local_3f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3f0 = "";
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    local_400 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x3e6;
    file_14.m_begin = (iterator)&local_3f8;
    msg_14.m_end = pvVar11;
    msg_14.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_408,
               msg_14);
    local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
    local_260._0_8_ = &PTR__lazy_ostream_01388f08;
    local_250 = boost::unit_test::lazy_ostream::inst;
    local_248 = "";
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(flags == -1);
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_108 = "";
    local_118 = (size_t *)&flags;
    ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
    local_140 = (uint256 *)&NO_ENTRY;
    local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
    local_138._0_8_ = &PTR__lazy_ostream_0138a530;
    local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_120 = &local_140;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x3e6,
               (lazy_ostream *)&ret_1,"NO_ENTRY",&local_138);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    CCoinsViewCache::AccessCoin(&view->super_CCoinsViewCache,&local_88);
    GetCoinsMapEntry(map,&value,&flags,&local_88);
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_410 = "";
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x3ea;
    file_15.m_begin = (iterator)&local_418;
    msg_15.m_end = pvVar11;
    msg_15.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_428,
               msg_15);
    local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
    local_260._0_8_ = &PTR__lazy_ostream_01388f08;
    local_250 = boost::unit_test::lazy_ostream::inst;
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(value == ret.super_base_blob<256U>.m_data._M_elems._0_8_);
    local_248 = "";
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_108 = "";
    ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
    local_140 = &ret;
    local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
    local_138._0_8_ = &PTR__lazy_ostream_013892a8;
    local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_120 = &local_140;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_118 = (size_t *)&value;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x3ea,
               (lazy_ostream *)&ret_1,"coin.out.nValue",&local_138);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    local_438 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_430 = "";
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x3eb;
    file_16.m_begin = (iterator)&local_438;
    msg_16.m_end = pvVar11;
    msg_16.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_448,
               msg_16);
    local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
    local_260._0_8_ = &PTR__lazy_ostream_01388f08;
    local_250 = boost::unit_test::lazy_ostream::inst;
    local_248 = "";
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(flags == '\0');
    coin_val = coin_val & 0xffffffff00000000;
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_108 = "";
    local_118 = (size_t *)&flags;
    ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
    ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
    local_140 = (uint256 *)&coin_val;
    local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
    local_138._0_8_ = &PTR__lazy_ostream_013890c8;
    local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_120 = &local_140;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x3eb,
               (lazy_ostream *)&ret_1,"0",&local_138);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  }
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x3f2;
  file_17.m_begin = (iterator)&local_458;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_468,
             msg_17);
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = ret.super_base_blob<256U>.m_data._M_elems[0];
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = ret.super_base_blob<256U>.m_data._M_elems[1];
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = ret.super_base_blob<256U>.m_data._M_elems[2];
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = ret.super_base_blob<256U>.m_data._M_elems[3];
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = ret.super_base_blob<256U>.m_data._M_elems[4];
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = ret.super_base_blob<256U>.m_data._M_elems[5];
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = ret.super_base_blob<256U>.m_data._M_elems[6];
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = ret.super_base_blob<256U>.m_data._M_elems[7];
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (ret_1.super_base_blob<256U>.m_data._M_elems + 8),
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (ret.super_base_blob<256U>.m_data._M_elems + 8));
  CCoinsViewCache::AddCoin(&view->super_CCoinsViewCache,&local_88,(Coin *)&ret_1,false);
  if (0x1c < local_c4) {
    free((void *)ret_1.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar12 = 0x32e2cd;
  file_18.m_end = (iterator)0x3f2;
  file_18.m_begin = (iterator)&local_478;
  msg_18.m_end = pvVar11;
  msg_18.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_488,
             msg_18);
  local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389e90;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = 'B';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = 0xb2;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xe4;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_490 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,1,WARN,_cVar12,(size_t)&local_498,0x3f2);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3f6;
  file_19.m_begin = (iterator)&local_4d8;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4e8,
             msg_19);
  _cVar12 = 0x32e38b;
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CCoinsViewCache::SpendCoin(&view->super_CCoinsViewCache,&local_88,(Coin *)0x0);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar5.super_readonly_property<bool>.super_class_property<bool>.value;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!view->SpendCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_4f0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_4f8,0x3f6);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  GetCoinsMapEntry(map,&value,&flags,&local_88);
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3fa;
  file_20.m_begin = (iterator)&local_508;
  msg_20.m_end = pvVar11;
  msg_20.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_518,
             msg_20);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&SPENT;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013892a8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&value;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(value == -1);
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x3fa,
             (lazy_ostream *)&ret_1,"SPENT",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3fb;
  file_21.m_begin = (iterator)&local_528;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_538,
             msg_21);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(flags == '\x01');
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  local_118 = (size_t *)&flags;
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&DIRTY;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0138a530;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x3fb,
             (lazy_ostream *)&ret_1,"DIRTY",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x3fc;
  file_22.m_begin = (iterator)&local_548;
  msg_22.m_end = pvVar11;
  msg_22.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_558,
             msg_22);
  _cVar12 = 0x32e748;
  iVar8 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,&local_88);
  local_138._0_8_ = CONCAT71(local_138._1_7_,(char)iVar8) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!view->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_560 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_568,0x3fc);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x3fd;
  file_23.m_begin = (iterator)&local_578;
  msg_23.m_end = pvVar11;
  msg_23.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_588,
             msg_23);
  _cVar12 = 0x32e828;
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar5.super_readonly_property<bool>.super_class_property<bool>.value;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!base.HaveCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_590 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_598,0x3fd);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  puVar9 = (all_caches->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != (all_caches->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    do {
      CCoinsViewCache::SanityCheck
                (&(puVar9[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
      puVar9 = puVar9 + -1;
      pCVar1 = &((puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl)->super_CCoinsViewCache;
      ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      output_02.m_size = 0x20;
      output_02.m_data = (byte *)&ret_1;
      FastRandomContext::fillrand(this_00,output_02);
      CCoinsViewCache::SetBestBlock(pCVar1,&ret_1);
      CCoinsViewCache::Sync
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
    } while (puVar9 != (all_caches->
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x402;
  file_24.m_begin = (iterator)&local_5a8;
  msg_24.m_end = pvVar11;
  msg_24.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5b8,
             msg_24);
  _cVar12 = 0x32e973;
  iVar8 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,&local_88);
  local_138._0_8_ = CONCAT71(local_138._1_7_,(char)iVar8) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!view->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5c0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_5c8,0x402);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x403;
  file_25.m_begin = (iterator)&local_5d8;
  msg_25.m_end = pvVar11;
  msg_25.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5e8,
             msg_25);
  _cVar12 = 0x32ea53;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5f0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_5f8,0x403);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x406;
  file_26.m_begin = (iterator)&local_608;
  msg_26.m_end = pvVar11;
  msg_26.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_618,
             msg_26);
  _cVar12 = 0x32eb34;
  bVar3 = CCoinsViewCache::SpendCoin(&view->super_CCoinsViewCache,&local_88,(Coin *)0x0);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!view->SpendCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_620 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_628,0x406);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output_03.m_size = 0x20;
  output_03.m_data = (byte *)&ret_1;
  FastRandomContext::fillrand(this_00,output_03);
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x14];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x15];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x16];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x17];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x10];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x11];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x12];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x13];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x18];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x19];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_58[0] = ret_1.super_base_blob<256U>.m_data._M_elems[0];
  local_58[1] = ret_1.super_base_blob<256U>.m_data._M_elems[1];
  local_58[2] = ret_1.super_base_blob<256U>.m_data._M_elems[2];
  local_58[3] = ret_1.super_base_blob<256U>.m_data._M_elems[3];
  local_58[4] = ret_1.super_base_blob<256U>.m_data._M_elems[4];
  local_58[5] = ret_1.super_base_blob<256U>.m_data._M_elems[5];
  local_58[6] = ret_1.super_base_blob<256U>.m_data._M_elems[6];
  local_58[7] = ret_1.super_base_blob<256U>.m_data._M_elems[7];
  auStack_50[0] = ret_1.super_base_blob<256U>.m_data._M_elems[8];
  auStack_50[1] = ret_1.super_base_blob<256U>.m_data._M_elems[9];
  auStack_50[2] = ret_1.super_base_blob<256U>.m_data._M_elems[10];
  auStack_50[3] = ret_1.super_base_blob<256U>.m_data._M_elems[0xb];
  auStack_50[4] = ret_1.super_base_blob<256U>.m_data._M_elems[0xc];
  auStack_50[5] = ret_1.super_base_blob<256U>.m_data._M_elems[0xd];
  auStack_50[6] = ret_1.super_base_blob<256U>.m_data._M_elems[0xe];
  auStack_50[7] = ret_1.super_base_blob<256U>.m_data._M_elems[0xf];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       ret_1.super_base_blob<256U>.m_data._M_elems[1];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       ret_1.super_base_blob<256U>.m_data._M_elems[2];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       ret_1.super_base_blob<256U>.m_data._M_elems[3];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       ret_1.super_base_blob<256U>.m_data._M_elems[4];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       ret_1.super_base_blob<256U>.m_data._M_elems[5];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       ret_1.super_base_blob<256U>.m_data._M_elems[6];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       ret_1.super_base_blob<256U>.m_data._M_elems[7];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       ret_1.super_base_blob<256U>.m_data._M_elems[8];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       ret_1.super_base_blob<256U>.m_data._M_elems[9];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       ret_1.super_base_blob<256U>.m_data._M_elems[10];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xb];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xc];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xd];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xe];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xf];
  local_88.n = 0;
  local_48 = (uchar  [8])local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  auStack_40 = (uchar  [8])local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  MakeCoin((Coin *)&ret_1,this);
  ret.super_base_blob<256U>.m_data._M_elems[0] = ret_1.super_base_blob<256U>.m_data._M_elems[0];
  ret.super_base_blob<256U>.m_data._M_elems[1] = ret_1.super_base_blob<256U>.m_data._M_elems[1];
  ret.super_base_blob<256U>.m_data._M_elems[2] = ret_1.super_base_blob<256U>.m_data._M_elems[2];
  ret.super_base_blob<256U>.m_data._M_elems[3] = ret_1.super_base_blob<256U>.m_data._M_elems[3];
  ret.super_base_blob<256U>.m_data._M_elems[4] = ret_1.super_base_blob<256U>.m_data._M_elems[4];
  ret.super_base_blob<256U>.m_data._M_elems[5] = ret_1.super_base_blob<256U>.m_data._M_elems[5];
  ret.super_base_blob<256U>.m_data._M_elems[6] = ret_1.super_base_blob<256U>.m_data._M_elems[6];
  ret.super_base_blob<256U>.m_data._M_elems[7] = ret_1.super_base_blob<256U>.m_data._M_elems[7];
  if (0x1c < local_94) {
    free((void *)ret.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  ret.super_base_blob<256U>.m_data._M_elems[0x18] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x18];
  ret.super_base_blob<256U>.m_data._M_elems[0x19] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x19];
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1a];
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1b];
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1c];
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1d];
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1e];
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1f];
  ret.super_base_blob<256U>.m_data._M_elems[8] = ret_1.super_base_blob<256U>.m_data._M_elems[8];
  ret.super_base_blob<256U>.m_data._M_elems[9] = ret_1.super_base_blob<256U>.m_data._M_elems[9];
  ret.super_base_blob<256U>.m_data._M_elems[10] = ret_1.super_base_blob<256U>.m_data._M_elems[10];
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = ret_1.super_base_blob<256U>.m_data._M_elems[0xb];
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = ret_1.super_base_blob<256U>.m_data._M_elems[0xc];
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = ret_1.super_base_blob<256U>.m_data._M_elems[0xd];
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = ret_1.super_base_blob<256U>.m_data._M_elems[0xe];
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = ret_1.super_base_blob<256U>.m_data._M_elems[0xf];
  ret.super_base_blob<256U>.m_data._M_elems[0x10] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x10];
  ret.super_base_blob<256U>.m_data._M_elems[0x11] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x11];
  ret.super_base_blob<256U>.m_data._M_elems[0x12] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x12];
  ret.super_base_blob<256U>.m_data._M_elems[0x13] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x13];
  ret.super_base_blob<256U>.m_data._M_elems[0x14] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x14];
  ret.super_base_blob<256U>.m_data._M_elems[0x15] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x15];
  ret.super_base_blob<256U>.m_data._M_elems[0x16] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x16];
  ret.super_base_blob<256U>.m_data._M_elems[0x17] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x17];
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x40e;
  file_27.m_begin = (iterator)&local_638;
  msg_27.m_end = pvVar11;
  msg_27.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_648,
             msg_27);
  _cVar12 = 0x32ecd0;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_650 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_658,0x40e);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x40f;
  file_28.m_begin = (iterator)&local_668;
  msg_28.m_end = pvVar11;
  msg_28.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_678,
             msg_28);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32edb2;
  bVar6 = (**(code **)(*(long *)_Var2._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var2._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar6 ^ 1);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[0]->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_680 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_688,0x40f);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x410;
  file_29.m_begin = (iterator)&local_698;
  msg_29.m_end = pvVar11;
  msg_29.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6a8,
             msg_29);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (all_caches->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32ee95;
  bVar6 = (**(code **)(*(long *)_Var2._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var2._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar6 ^ 1);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[1]->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6b0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_6b8,0x410);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  CCoinsViewCache::AddCoin
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t,&local_88,(Coin *)&ret,false);
  CCoinsViewCache::Sync
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t);
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x414;
  file_30.m_begin = (iterator)&local_6c8;
  msg_30.m_end = pvVar11;
  msg_30.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6d8,
             msg_30);
  _cVar12 = 0x32efa4;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!base.HaveCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6e0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_6e8,0x414);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x415;
  file_31.m_begin = (iterator)&local_6f8;
  msg_31.m_end = pvVar11;
  msg_31.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_708,
             msg_31);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32f084;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (**(code **)(*(long *)_Var2._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                             ._M_head_impl + 8))
                 (_Var2._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = (long)"!all_caches[0]->HaveCoin(outp)" + 1;
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_710 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_718,0x415);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x416;
  file_32.m_begin = (iterator)&local_728;
  msg_32.m_end = pvVar11;
  msg_32.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_738,
             msg_32);
  _cVar12 = 0x32f164;
  bVar3 = CCoinsViewCache::HaveCoinInCache
                    ((CCoinsViewCache *)
                     (all_caches->
                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[1]->HaveCoinInCache(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_740 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_748,0x416);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x418;
  file_33.m_begin = (iterator)&local_758;
  msg_33.m_end = pvVar11;
  msg_33.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_768,
             msg_33);
  _cVar12 = 0x32f248;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CCoinsViewCache::SpendCoin
                 ((CCoinsViewCache *)
                  (all_caches->
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t,&local_88,(Coin *)0x0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "all_caches[1]->SpendCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_770 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_778,0x418);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  puVar9 = (all_caches->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != (all_caches->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    do {
      CCoinsViewCache::SanityCheck
                (&(puVar9[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
      puVar9 = puVar9 + -1;
      pCVar1 = &((puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl)->super_CCoinsViewCache;
      ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      output_04.m_size = 0x20;
      output_04.m_data = (byte *)&ret_1;
      FastRandomContext::fillrand(this_00,output_04);
      CCoinsViewCache::SetBestBlock(pCVar1,&ret_1);
      CCoinsViewCache::Sync
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
    } while (puVar9 != (all_caches->
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x41a;
  file_34.m_begin = (iterator)&local_788;
  msg_34.m_end = pvVar11;
  msg_34.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_798,
             msg_34);
  _cVar12 = 0x32f393;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7a0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_7a8,0x41a);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x41b;
  file_35.m_begin = (iterator)&local_7b8;
  msg_35.m_end = pvVar11;
  msg_35.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_7c8,
             msg_35);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32f475;
  bVar6 = (**(code **)(*(long *)_Var2._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var2._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar6 ^ 1);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[0]->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7d0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_7d8,0x41b);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x41c;
  file_36.m_begin = (iterator)&local_7e8;
  msg_36.m_end = pvVar11;
  msg_36.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7f8,
             msg_36);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (all_caches->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32f558;
  uVar7 = (**(code **)(*(long *)_Var2._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var2._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,&local_88);
  local_138._0_8_ = CONCAT71(local_138._1_7_,uVar7) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[1]->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_800 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_808,0x41c);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  puVar9 = (all_caches->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != (all_caches->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    do {
      CCoinsViewCache::SanityCheck
                (&(puVar9[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
      puVar9 = puVar9 + -1;
      pCVar1 = &((puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl)->super_CCoinsViewCache;
      ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      output_05.m_size = 0x20;
      output_05.m_data = (byte *)&ret_1;
      FastRandomContext::fillrand(this_00,output_05);
      CCoinsViewCache::SetBestBlock(pCVar1,&ret_1);
      CCoinsViewCache::Flush
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache);
    } while (puVar9 != (all_caches->
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output_06.m_size = 0x20;
  output_06.m_data = (byte *)&ret_1;
  FastRandomContext::fillrand(this_00,output_06);
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x14];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x15];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x16];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x17];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x10];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x11];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x12];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x13];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x18];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x19];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_58[0] = ret_1.super_base_blob<256U>.m_data._M_elems[0];
  local_58[1] = ret_1.super_base_blob<256U>.m_data._M_elems[1];
  local_58[2] = ret_1.super_base_blob<256U>.m_data._M_elems[2];
  local_58[3] = ret_1.super_base_blob<256U>.m_data._M_elems[3];
  local_58[4] = ret_1.super_base_blob<256U>.m_data._M_elems[4];
  local_58[5] = ret_1.super_base_blob<256U>.m_data._M_elems[5];
  local_58[6] = ret_1.super_base_blob<256U>.m_data._M_elems[6];
  local_58[7] = ret_1.super_base_blob<256U>.m_data._M_elems[7];
  auStack_50[0] = ret_1.super_base_blob<256U>.m_data._M_elems[8];
  auStack_50[1] = ret_1.super_base_blob<256U>.m_data._M_elems[9];
  auStack_50[2] = ret_1.super_base_blob<256U>.m_data._M_elems[10];
  auStack_50[3] = ret_1.super_base_blob<256U>.m_data._M_elems[0xb];
  auStack_50[4] = ret_1.super_base_blob<256U>.m_data._M_elems[0xc];
  auStack_50[5] = ret_1.super_base_blob<256U>.m_data._M_elems[0xd];
  auStack_50[6] = ret_1.super_base_blob<256U>.m_data._M_elems[0xe];
  auStack_50[7] = ret_1.super_base_blob<256U>.m_data._M_elems[0xf];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       ret_1.super_base_blob<256U>.m_data._M_elems[1];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       ret_1.super_base_blob<256U>.m_data._M_elems[2];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       ret_1.super_base_blob<256U>.m_data._M_elems[3];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       ret_1.super_base_blob<256U>.m_data._M_elems[4];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       ret_1.super_base_blob<256U>.m_data._M_elems[5];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       ret_1.super_base_blob<256U>.m_data._M_elems[6];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       ret_1.super_base_blob<256U>.m_data._M_elems[7];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       ret_1.super_base_blob<256U>.m_data._M_elems[8];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       ret_1.super_base_blob<256U>.m_data._M_elems[9];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       ret_1.super_base_blob<256U>.m_data._M_elems[10];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xb];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xc];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xd];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xe];
  local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0xf];
  local_88.n = 0;
  local_48 = (uchar  [8])local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  auStack_40 = (uchar  [8])local_88.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  MakeCoin((Coin *)&ret_1,this);
  ret.super_base_blob<256U>.m_data._M_elems[0] = ret_1.super_base_blob<256U>.m_data._M_elems[0];
  ret.super_base_blob<256U>.m_data._M_elems[1] = ret_1.super_base_blob<256U>.m_data._M_elems[1];
  ret.super_base_blob<256U>.m_data._M_elems[2] = ret_1.super_base_blob<256U>.m_data._M_elems[2];
  ret.super_base_blob<256U>.m_data._M_elems[3] = ret_1.super_base_blob<256U>.m_data._M_elems[3];
  ret.super_base_blob<256U>.m_data._M_elems[4] = ret_1.super_base_blob<256U>.m_data._M_elems[4];
  ret.super_base_blob<256U>.m_data._M_elems[5] = ret_1.super_base_blob<256U>.m_data._M_elems[5];
  ret.super_base_blob<256U>.m_data._M_elems[6] = ret_1.super_base_blob<256U>.m_data._M_elems[6];
  ret.super_base_blob<256U>.m_data._M_elems[7] = ret_1.super_base_blob<256U>.m_data._M_elems[7];
  if (0x1c < local_c4) {
    free((void *)ret.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  ret.super_base_blob<256U>.m_data._M_elems[0x18] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x18];
  ret.super_base_blob<256U>.m_data._M_elems[0x19] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x19];
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1a];
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1b];
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1c];
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1d];
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1e];
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x1f];
  ret.super_base_blob<256U>.m_data._M_elems[8] = ret_1.super_base_blob<256U>.m_data._M_elems[8];
  ret.super_base_blob<256U>.m_data._M_elems[9] = ret_1.super_base_blob<256U>.m_data._M_elems[9];
  ret.super_base_blob<256U>.m_data._M_elems[10] = ret_1.super_base_blob<256U>.m_data._M_elems[10];
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = ret_1.super_base_blob<256U>.m_data._M_elems[0xb];
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = ret_1.super_base_blob<256U>.m_data._M_elems[0xc];
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = ret_1.super_base_blob<256U>.m_data._M_elems[0xd];
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = ret_1.super_base_blob<256U>.m_data._M_elems[0xe];
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = ret_1.super_base_blob<256U>.m_data._M_elems[0xf];
  ret.super_base_blob<256U>.m_data._M_elems[0x10] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x10];
  ret.super_base_blob<256U>.m_data._M_elems[0x11] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x11];
  ret.super_base_blob<256U>.m_data._M_elems[0x12] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x12];
  ret.super_base_blob<256U>.m_data._M_elems[0x13] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x13];
  ret.super_base_blob<256U>.m_data._M_elems[0x14] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x14];
  ret.super_base_blob<256U>.m_data._M_elems[0x15] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x15];
  ret.super_base_blob<256U>.m_data._M_elems[0x16] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x16];
  ret.super_base_blob<256U>.m_data._M_elems[0x17] =
       ret_1.super_base_blob<256U>.m_data._M_elems[0x17];
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x426;
  file_37.m_begin = (iterator)&local_818;
  msg_37.m_end = pvVar11;
  msg_37.m_begin = pvVar10;
  coin_val = ret.super_base_blob<256U>.m_data._M_elems._0_8_;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_828,
             msg_37);
  _cVar12 = 0x32f771;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_830 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_838,0x426);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x427;
  file_38.m_begin = (iterator)&local_848;
  msg_38.m_end = pvVar11;
  msg_38.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_858,
             msg_38);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32f853;
  bVar6 = (**(code **)(*(long *)_Var2._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var2._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar6 ^ 1);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[0]->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_860 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_868,0x427);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x428;
  file_39.m_begin = (iterator)&local_878;
  msg_39.m_end = pvVar11;
  msg_39.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_888,
             msg_39);
  _Var2._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (all_caches->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  _cVar12 = 0x32f936;
  uVar7 = (**(code **)(*(long *)_Var2._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var2._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,&local_88);
  local_138._0_8_ = CONCAT71(local_138._1_7_,uVar7) ^ 1;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[1]->HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_890 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_898,0x428);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  CCoinsViewCache::AddCoin
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t,&local_88,(Coin *)&ret,false);
  GetCoinsMapEntry((CCoinsMap *)
                   ((long)(((all_caches->
                            super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t + 0x170),&value,&flags,&local_88);
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x42f;
  file_40.m_begin = (iterator)&local_8a8;
  msg_40.m_end = pvVar11;
  msg_40.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_8b8,
             msg_40);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&coin_val;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013892a8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&value;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(value == coin_val);
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x42f,
             (lazy_ostream *)&ret_1,"coin_val",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x430;
  file_41.m_begin = (iterator)&local_8c8;
  msg_41.m_end = pvVar11;
  msg_41.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8d8,
             msg_41);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_140 = (uint256 *)local_8dc;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(flags == '\x03');
  local_8dc[0] = '\x03';
  local_8dc[1] = '\0';
  local_8dc[2] = '\0';
  local_8dc[3] = '\0';
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  local_118 = (size_t *)&flags;
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013890c8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x430,
             (lazy_ostream *)&ret_1,"DIRTY|FRESH",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x433;
  file_42.m_begin = (iterator)&local_8f0;
  msg_42.m_end = pvVar11;
  msg_42.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_900,
             msg_42);
  _cVar12 = 0x32fd1c;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_908 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_910,0x433);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x435;
  file_43.m_begin = (iterator)&local_920;
  msg_43.m_end = pvVar11;
  msg_43.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_930,
             msg_43);
  _cVar12 = 0x32fdff;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CCoinsViewCache::SpendCoin
                 ((CCoinsViewCache *)
                  (((all_caches->
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t,&local_88,(Coin *)0x0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "all_caches[0]->SpendCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_938 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_940,0x435);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  CCoinsViewCache::Sync
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t);
  GetCoinsMapEntry((CCoinsMap *)
                   ((long)(((all_caches->
                            super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t + 0x170),&value,&flags,&local_88);
  local_950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_948 = "";
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x43a;
  file_44.m_begin = (iterator)&local_950;
  msg_44.m_end = pvVar11;
  msg_44.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_960,
             msg_44);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(value == -2);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013892a8;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&ABSENT;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013892a8;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_118 = (size_t *)&value;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xe299b5,(size_t)&local_110,0x43a,
             (lazy_ostream *)&ret_1,"ABSENT",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x43b;
  file_45.m_begin = (iterator)&local_970;
  msg_45.m_end = pvVar11;
  msg_45.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_980,
             msg_45);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_01388f08;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(flags == -1);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_108 = "";
  local_118 = (size_t *)&flags;
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138a530;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_118;
  local_140 = (uint256 *)&NO_ENTRY;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0138a530;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_260,1,2,REQUIRE,0xfba8d9,(size_t)&local_110,0x43b,
             (lazy_ostream *)&ret_1,"NO_ENTRY",&local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_988 = "";
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x43c;
  file_46.m_begin = (iterator)&local_990;
  msg_46.m_end = pvVar11;
  msg_46.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_9a0,
             msg_46);
  _cVar12 = 0x3301b3;
  bVar3 = CCoinsViewCache::HaveCoinInCache
                    ((CCoinsViewCache *)
                     (((all_caches->
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t,&local_88);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!all_caches[0]->HaveCoinInCache(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9a8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_9b0,0x43c);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9b8 = "";
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x43d;
  file_47.m_begin = (iterator)&local_9c0;
  msg_47.m_end = pvVar11;
  msg_47.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_9d0,
             msg_47);
  _cVar12 = 0x33028a;
  bVar3 = CCoinsViewDB::HaveCoin(base,&local_88);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!base.HaveCoin(outp)";
  local_260._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = 0xd1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '9';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_9e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9d8 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&ret_1,1,0,WARN,_cVar12,(size_t)&local_9e0,0x43d);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  if (0x1c < local_c4) {
    free((void *)ret.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestFlushBehavior(
    CCoinsViewCacheTest* view,
    CCoinsViewDB& base,
    std::vector<std::unique_ptr<CCoinsViewCacheTest>>& all_caches,
    bool do_erasing_flush)
{
    CAmount value;
    char flags;
    size_t cache_usage;
    size_t cache_size;

    auto flush_all = [this, &all_caches](bool erase) {
        // Flush in reverse order to ensure that flushes happen from children up.
        for (auto i = all_caches.rbegin(); i != all_caches.rend(); ++i) {
            auto& cache = *i;
            cache->SanityCheck();
            // hashBlock must be filled before flushing to disk; value is
            // unimportant here. This is normally done during connect/disconnect block.
            cache->SetBestBlock(m_rng.rand256());
            erase ? cache->Flush() : cache->Sync();
        }
    };

    Txid txid = Txid::FromUint256(m_rng.rand256());
    COutPoint outp = COutPoint(txid, 0);
    Coin coin = MakeCoin();
    // Ensure the coins views haven't seen this coin before.
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!view->HaveCoin(outp));

    // --- 1. Adding a random coin to the child cache
    //
    view->AddCoin(outp, Coin(coin), false);

    cache_usage = view->DynamicMemoryUsage();
    cache_size = view->map().size();

    // `base` shouldn't have coin (no flush yet) but `view` should have cached it.
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(view->HaveCoin(outp));

    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin.out.nValue);
    BOOST_CHECK_EQUAL(flags, DIRTY|FRESH);

    // --- 2. Flushing all caches (without erasing)
    //
    flush_all(/*erase=*/ false);

    // CoinsMap usage should be unchanged since we didn't erase anything.
    BOOST_CHECK_EQUAL(cache_usage, view->DynamicMemoryUsage());
    BOOST_CHECK_EQUAL(cache_size, view->map().size());

    // --- 3. Ensuring the entry still exists in the cache and has been written to parent
    //
    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin.out.nValue);
    BOOST_CHECK_EQUAL(flags, 0);  // Flags should have been wiped.

    // Both views should now have the coin.
    BOOST_CHECK(base.HaveCoin(outp));
    BOOST_CHECK(view->HaveCoin(outp));

    if (do_erasing_flush) {
        // --- 4. Flushing the caches again (with erasing)
        //
        flush_all(/*erase=*/ true);

        // Memory does not necessarily go down due to the map using a memory pool
        BOOST_TEST(view->DynamicMemoryUsage() <= cache_usage);
        // Size of the cache must go down though
        BOOST_TEST(view->map().size() < cache_size);

        // --- 5. Ensuring the entry is no longer in the cache
        //
        GetCoinsMapEntry(view->map(), value, flags, outp);
        BOOST_CHECK_EQUAL(value, ABSENT);
        BOOST_CHECK_EQUAL(flags, NO_ENTRY);

        view->AccessCoin(outp);
        GetCoinsMapEntry(view->map(), value, flags, outp);
        BOOST_CHECK_EQUAL(value, coin.out.nValue);
        BOOST_CHECK_EQUAL(flags, 0);
    }

    // Can't overwrite an entry without specifying that an overwrite is
    // expected.
    BOOST_CHECK_THROW(
        view->AddCoin(outp, Coin(coin), /*possible_overwrite=*/ false),
        std::logic_error);

    // --- 6. Spend the coin.
    //
    BOOST_CHECK(view->SpendCoin(outp));

    // The coin should be in the cache, but spent and marked dirty.
    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, SPENT);
    BOOST_CHECK_EQUAL(flags, DIRTY);
    BOOST_CHECK(!view->HaveCoin(outp)); // Coin should be considered spent in `view`.
    BOOST_CHECK(base.HaveCoin(outp));  // But coin should still be unspent in `base`.

    flush_all(/*erase=*/ false);

    // Coin should be considered spent in both views.
    BOOST_CHECK(!view->HaveCoin(outp));
    BOOST_CHECK(!base.HaveCoin(outp));

    // Spent coin should not be spendable.
    BOOST_CHECK(!view->SpendCoin(outp));

    // --- Bonus check: ensure that a coin added to the base view via one cache
    //     can be spent by another cache which has never seen it.
    //
    txid = Txid::FromUint256(m_rng.rand256());
    outp = COutPoint(txid, 0);
    coin = MakeCoin();
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    all_caches[0]->AddCoin(outp, std::move(coin), false);
    all_caches[0]->Sync();
    BOOST_CHECK(base.HaveCoin(outp));
    BOOST_CHECK(all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoinInCache(outp));

    BOOST_CHECK(all_caches[1]->SpendCoin(outp));
    flush_all(/*erase=*/ false);
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    flush_all(/*erase=*/ true); // Erase all cache content.

    // --- Bonus check 2: ensure that a FRESH, spent coin is deleted by Sync()
    //
    txid = Txid::FromUint256(m_rng.rand256());
    outp = COutPoint(txid, 0);
    coin = MakeCoin();
    CAmount coin_val = coin.out.nValue;
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    // Add and spend from same cache without flushing.
    all_caches[0]->AddCoin(outp, std::move(coin), false);

    // Coin should be FRESH in the cache.
    GetCoinsMapEntry(all_caches[0]->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin_val);
    BOOST_CHECK_EQUAL(flags, DIRTY|FRESH);

    // Base shouldn't have seen coin.
    BOOST_CHECK(!base.HaveCoin(outp));

    BOOST_CHECK(all_caches[0]->SpendCoin(outp));
    all_caches[0]->Sync();

    // Ensure there is no sign of the coin after spend/flush.
    GetCoinsMapEntry(all_caches[0]->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, ABSENT);
    BOOST_CHECK_EQUAL(flags, NO_ENTRY);
    BOOST_CHECK(!all_caches[0]->HaveCoinInCache(outp));
    BOOST_CHECK(!base.HaveCoin(outp));
}